

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::is_per_primitive_variable(CompilerGLSL *this,SPIRVariable *var)

{
  uint uVar1;
  uint32_t uVar2;
  bool bVar3;
  SPIRType *pSVar4;
  uint32_t index;
  bool bVar5;
  
  bVar3 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                     DecorationPerPrimitiveEXT);
  bVar5 = true;
  if (!bVar3) {
    pSVar4 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(var->super_IVariant).field_0xc);
    bVar3 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,Block);
    if (bVar3) {
      uVar1 = (uint)(pSVar4->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      bVar5 = uVar1 == 0;
      if (!bVar5) {
        bVar3 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,0,
                           DecorationPerPrimitiveEXT);
        if (bVar3) {
          uVar2 = 1;
          do {
            index = uVar2;
            if (uVar1 == index) break;
            bVar3 = Compiler::has_member_decoration
                              (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,index,
                               DecorationPerPrimitiveEXT);
            uVar2 = index + 1;
          } while (bVar3);
          bVar5 = uVar1 <= index;
        }
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool CompilerGLSL::is_per_primitive_variable(const SPIRVariable &var) const
{
	if (has_decoration(var.self, DecorationPerPrimitiveEXT))
		return true;

	auto &type = get<SPIRType>(var.basetype);
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0, n = uint32_t(type.member_types.size()); i < n; i++)
		if (!has_member_decoration(type.self, i, DecorationPerPrimitiveEXT))
			return false;

	return true;
}